

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O1

ssize_t cf_h2_send(Curl_cfilter *cf,Curl_easy *data,void *buf,size_t len,CURLcode *err)

{
  h1_req_parser *parser;
  cf_h2_ctx *ctx;
  HTTP *pHVar1;
  Curl_easy *pCVar2;
  curl_off_t cVar3;
  _Bool _Var4;
  CURLcode CVar5;
  uint uVar6;
  int iVar7;
  int32_t iVar8;
  int32_t iVar9;
  uint uVar10;
  ulong uVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar12;
  size_t sVar13;
  nghttp2_nv *nva;
  long lVar14;
  long lVar15;
  char *pcVar16;
  ssize_t sVar17;
  bool bVar18;
  long lVar19;
  ulong uVar20;
  nghttp2_session *session;
  nghttp2_data_provider *data_prd_00;
  ulong uVar21;
  stream_ctx *psVar22;
  size_t *psVar23;
  size_t nheader;
  stream_ctx *stream;
  ulong local_90;
  nghttp2_priority_spec local_84;
  dynhds h2_headers;
  nghttp2_data_provider data_prd;
  
  ctx = (cf_h2_ctx *)cf->ctx;
  if ((data == (Curl_easy *)0x0) || (pHVar1 = (data->req).p.http, pHVar1 == (HTTP *)0x0)) {
    psVar22 = (stream_ctx *)0x0;
  }
  else {
    psVar22 = (stream_ctx *)pHVar1->h2_ctx;
  }
  pCVar2 = (ctx->call_data).data;
  (ctx->call_data).data = data;
  if ((psVar22 == (stream_ctx *)0x0) || (psVar22->id == 0xffffffff)) {
    stream = (stream_ctx *)0x0;
    nva = (nghttp2_nv *)0x0;
    Curl_dynhds_init(&h2_headers,0,0x100000);
    CVar5 = http2_data_setup(cf,data,&stream);
    psVar22 = stream;
    *err = CVar5;
    uVar20 = 0xffffffffffffffff;
    uVar11 = uVar20;
    if (CVar5 == CURLE_OK) {
      parser = &stream->h1;
      uVar11 = Curl_h1_req_parse_read(parser,(char *)buf,len,(char *)0x0,0,err);
      if ((-1 < (long)uVar11) && ((psVar22->h1).done == true)) {
        local_90 = uVar11;
        CVar5 = Curl_http_req_to_h2(&h2_headers,parser->req,data);
        *err = CVar5;
        uVar11 = uVar20;
        if (CVar5 == CURLE_OK) {
          Curl_h1_req_parse_free(parser);
          nva = Curl_dynhds_to_nva(&h2_headers,&nheader);
          if (nva != (nghttp2_nv *)0x0) {
            h2_pri_spec(data,&local_84);
            iVar7 = nghttp2_session_check_request_allowed(ctx->h2);
            if ((((data != (Curl_easy *)0x0) && (iVar7 == 0)) && (cf != (Curl_cfilter *)0x0)) &&
               (((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0 && (0 < cf->cft->log_level))
               )) {
              Curl_trc_cf_infof(data,cf,"send request NOT allowed (via nghttp2)");
            }
            if ((byte)((data->state).httpreq - 1) < 4) {
              psVar22->upload_left = (data->state).infilesize;
              data_prd_00 = &data_prd;
              data_prd.read_callback = req_body_read_callback;
              data_prd.source.ptr = (void *)0x0;
              session = ctx->h2;
            }
            else {
              psVar22->upload_left = 0;
              session = ctx->h2;
              data_prd_00 = (nghttp2_data_provider *)0x0;
            }
            uVar10 = nghttp2_submit_request(session,&local_84,nva,nheader,data_prd_00,data);
            if ((int)uVar10 < 0) {
              if (((data != (Curl_easy *)0x0) && (cf != (Curl_cfilter *)0x0)) &&
                 (((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0 &&
                  (0 < cf->cft->log_level)))) {
                pcVar16 = nghttp2_strerror(uVar10);
                Curl_trc_cf_infof(data,cf,"send: nghttp2_submit_request error (%s)%u",pcVar16,
                                  (ulong)uVar10);
              }
              *err = CURLE_SEND_ERROR;
            }
            else {
              if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) &&
                 (Curl_infof(data,"[HTTP/2] [%d] OPENED stream for %s",(ulong)uVar10), nheader != 0)
                 ) {
                psVar23 = &nva->valuelen;
                uVar11 = 0;
                uVar21 = 0;
                do {
                  sVar12 = psVar23[-1];
                  sVar13 = *psVar23;
                  if (((data->set).field_0x8bd & 0x10) != 0) {
                    Curl_infof(data,"[HTTP/2] [%d] [%.*s: %.*s]",(ulong)uVar10,sVar12,
                               ((nghttp2_nv *)(psVar23 + -3))->name,sVar13,(uint8_t *)psVar23[-2]);
                  }
                  uVar11 = uVar11 + sVar12 + sVar13;
                  uVar21 = uVar21 + 1;
                  psVar23 = psVar23 + 5;
                } while (uVar21 < nheader);
                if ((60000 < uVar11) && (((data->set).field_0x8bd & 0x10) != 0)) {
                  Curl_infof(data,
                             "[HTTP/2] Warning: The cumulative length of all headers exceeds %d bytes and that could cause the stream to be rejected."
                             ,60000);
                }
              }
              uVar11 = local_90;
              psVar22->id = uVar10;
              psVar22->local_window_size = 0xa00000;
              lVar15 = (data->set).max_recv_speed;
              if (lVar15 != 0) {
                lVar19 = lVar15 + 0x3ffe;
                if (-1 < lVar15 + -1) {
                  lVar19 = lVar15 + -1;
                }
                lVar19 = lVar19 >> 0xe;
                lVar14 = 1;
                if (0xc000 < lVar15) {
                  lVar14 = (lVar19 - (lVar19 + 1 >> 0x3f)) + 1 >> 1;
                }
                lVar15 = lVar14 + lVar19 + 1;
                if (lVar15 < 0x280) {
                  psVar22->local_window_size = (int)lVar15 << 0xe;
                }
              }
              if (len - local_90 != 0) {
                sVar17 = Curl_bufq_write(&psVar22->sendbuf,(uchar *)((long)buf + local_90),
                                         len - local_90,err);
                if (sVar17 < 0) {
                  *err = CURLE_SEND_ERROR;
                  uVar11 = uVar20;
                }
                else {
                  uVar11 = sVar17 + uVar11;
                }
              }
            }
            goto LAB_007235f8;
          }
          *err = CURLE_OUT_OF_MEMORY;
        }
      }
      nva = (nghttp2_nv *)0x0;
    }
LAB_007235f8:
    if (((data != (Curl_easy *)0x0) && (cf != (Curl_cfilter *)0x0)) &&
       (((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0 && (0 < cf->cft->log_level)))) {
      if (stream == (stream_ctx *)0x0) {
        uVar20 = 0xffffffff;
      }
      else {
        uVar20 = (ulong)(uint)stream->id;
      }
      Curl_trc_cf_infof(data,cf,"[%d] submit -> %zd, %d",uVar20,uVar11,(ulong)*err);
    }
    (*Curl_cfree)(nva);
    psVar22 = stream;
    Curl_dynhds_free(&h2_headers);
    bVar18 = false;
    if ((long)uVar11 < 0) goto LAB_0072389c;
    goto LAB_00723675;
  }
  uVar11 = psVar22->upload_blocked_len;
  if (uVar11 == 0) {
    if (psVar22->closed == true) {
      if (psVar22->resp_hds_complete == true) {
        if ((((data != (Curl_easy *)0x0) && (cf != (Curl_cfilter *)0x0)) &&
            ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0)) && (0 < cf->cft->log_level)) {
          Curl_trc_cf_infof(data,cf,"[%d] discarding dataon closed stream with response");
        }
        *err = CURLE_OK;
        uVar11 = len;
      }
      else {
        if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
          Curl_infof(data,"stream %u closed",(ulong)(uint)psVar22->id);
        }
        *err = CURLE_SEND_ERROR;
        uVar11 = 0xffffffffffffffff;
      }
      goto LAB_0072389c;
    }
    uVar11 = Curl_bufq_write(&psVar22->sendbuf,(uchar *)buf,len,err);
    bVar18 = false;
    if (((long)uVar11 < 0) && (*err != CURLE_AGAIN)) goto LAB_0072389c;
LAB_0072385a:
    _Var4 = Curl_bufq_is_empty(&psVar22->sendbuf);
    if (_Var4) {
LAB_00723675:
      CVar5 = h2_progress_egress(cf,data);
      if (((psVar22 == (stream_ctx *)0x0) || (bVar18)) || (psVar22->closed == false)) {
        if (CVar5 == CURLE_OK) {
          if (psVar22 == (stream_ctx *)0x0) {
            bVar18 = false;
          }
          else {
            _Var4 = Curl_bufq_is_empty(&psVar22->sendbuf);
            bVar18 = !_Var4;
          }
        }
        else {
          bVar18 = true;
          if (CVar5 != CURLE_AGAIN) {
            *err = CVar5;
            goto LAB_00723895;
          }
        }
        if ((((long)uVar11 < 1) || (psVar22 == (stream_ctx *)0x0)) || (!bVar18)) {
          iVar7 = should_close_session(ctx);
          if (iVar7 == 0) goto LAB_0072389c;
          if (psVar22->closed == true) {
            uVar11 = http2_handle_stream_close(cf,data,psVar22,err);
            goto LAB_0072389c;
          }
          if (((data != (Curl_easy *)0x0) && (cf != (Curl_cfilter *)0x0)) &&
             (((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0 && (0 < cf->cft->log_level))))
          {
            Curl_trc_cf_infof(data,cf,"send: nothing to do in this session");
          }
          *err = CURLE_HTTP2;
        }
        else {
          iVar8 = nghttp2_session_get_stream_remote_window_size(ctx->h2,psVar22->id);
          psVar22->upload_blocked_len = uVar11;
          if (((data != (Curl_easy *)0x0) && (cf != (Curl_cfilter *)0x0)) &&
             (((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0 && (0 < cf->cft->log_level))))
          {
            uVar10 = psVar22->id;
            uVar6 = nghttp2_session_get_remote_window_size(ctx->h2);
            Curl_trc_cf_infof(data,cf,"[%d] cf_send(len=%zu) BLOCK: win %u/%zu blocked_len=%zu",
                              (ulong)uVar10,len,(ulong)uVar6,(long)iVar8,uVar11);
          }
          *err = CURLE_AGAIN;
        }
        goto LAB_00723895;
      }
      if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
        Curl_infof(data,"stream %u closed",(ulong)(uint)psVar22->id);
      }
    }
    else {
      iVar7 = nghttp2_session_resume_data(ctx->h2,psVar22->id);
      iVar7 = nghttp2_is_fatal(iVar7);
      if (iVar7 == 0) goto LAB_00723675;
    }
    *err = CURLE_SEND_ERROR;
  }
  else {
    if (uVar11 <= len) {
      psVar22->upload_blocked_len = 0;
      bVar18 = true;
      goto LAB_0072385a;
    }
    Curl_failf(data,"HTTP/2 send again with decreased length (%zd vs %zd)",len,uVar11);
    *err = CURLE_HTTP2;
  }
LAB_00723895:
  uVar11 = 0xffffffffffffffff;
LAB_0072389c:
  if (psVar22 == (stream_ctx *)0x0) {
    if ((((data != (Curl_easy *)0x0) && (cf != (Curl_cfilter *)0x0)) &&
        ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0)) && (0 < cf->cft->log_level)) {
      CVar5 = *err;
      uVar10 = nghttp2_session_get_remote_window_size(ctx->h2);
      sVar12 = Curl_bufq_len(&ctx->outbufq);
      Curl_trc_cf_infof(data,cf,
                        "cf_send(len=%zu) -> %zd, %d, connection-window=%d, nw_send_buffer(%zu)",len
                        ,uVar11,CVar5,(ulong)uVar10,sVar12);
    }
  }
  else if (((data != (Curl_easy *)0x0) && (cf != (Curl_cfilter *)0x0)) &&
          (((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0 && (0 < cf->cft->log_level)))) {
    uVar10 = psVar22->id;
    CVar5 = *err;
    cVar3 = psVar22->upload_left;
    iVar8 = nghttp2_session_get_stream_remote_window_size(ctx->h2,uVar10);
    iVar9 = nghttp2_session_get_remote_window_size(ctx->h2);
    sVar12 = Curl_bufq_len(&psVar22->sendbuf);
    sVar13 = Curl_bufq_len(&ctx->outbufq);
    Curl_trc_cf_infof(data,cf,
                      "[%d] cf_send(len=%zu) -> %zd, %d, upload_left=%ld, h2 windows %d-%d (stream-conn), buffers %zu-%zu (stream-conn)"
                      ,(ulong)uVar10,len,uVar11,(ulong)CVar5,cVar3,CONCAT44(extraout_var,iVar8),
                      CONCAT44(extraout_var_00,iVar9),sVar12,sVar13);
  }
  *(Curl_easy **)((long)cf->ctx + 0x10) = pCVar2;
  return uVar11;
}

Assistant:

static ssize_t cf_h2_send(struct Curl_cfilter *cf, struct Curl_easy *data,
                          const void *buf, size_t len, CURLcode *err)
{
  struct cf_h2_ctx *ctx = cf->ctx;
  struct stream_ctx *stream = H2_STREAM_CTX(data);
  struct cf_call_data save;
  int rv;
  ssize_t nwritten;
  CURLcode result;
  int blocked = 0, was_blocked = 0;

  CF_DATA_SAVE(save, cf, data);

  if(stream && stream->id != -1) {
    if(stream->upload_blocked_len) {
      /* the data in `buf` has already been submitted or added to the
       * buffers, but have been EAGAINed on the last invocation. */
      /* TODO: this assertion triggers in OSSFuzz runs and it is not
       * clear why. Disable for now to let OSSFuzz continue its tests. */
      DEBUGASSERT(len >= stream->upload_blocked_len);
      if(len < stream->upload_blocked_len) {
        /* Did we get called again with a smaller `len`? This should not
         * happen. We are not prepared to handle that. */
        failf(data, "HTTP/2 send again with decreased length (%zd vs %zd)",
              len, stream->upload_blocked_len);
        *err = CURLE_HTTP2;
        nwritten = -1;
        goto out;
      }
      nwritten = (ssize_t)stream->upload_blocked_len;
      stream->upload_blocked_len = 0;
      was_blocked = 1;
    }
    else if(stream->closed) {
      if(stream->resp_hds_complete) {
        /* Server decided to close the stream after having sent us a findl
         * response. This is valid if it is not interested in the request
         * body. This happens on 30x or 40x responses.
         * We silently discard the data sent, since this is not a transport
         * error situation. */
        CURL_TRC_CF(data, cf, "[%d] discarding data"
                    "on closed stream with response", stream->id);
        *err = CURLE_OK;
        nwritten = (ssize_t)len;
        goto out;
      }
      infof(data, "stream %u closed", stream->id);
      *err = CURLE_SEND_ERROR;
      nwritten = -1;
      goto out;
    }
    else {
      /* If stream_id != -1, we have dispatched request HEADERS and
       * optionally request body, and now are going to send or sending
       * more request body in DATA frame */
      nwritten = Curl_bufq_write(&stream->sendbuf, buf, len, err);
      if(nwritten < 0 && *err != CURLE_AGAIN)
        goto out;
    }

    if(!Curl_bufq_is_empty(&stream->sendbuf)) {
      /* req body data is buffered, resume the potentially suspended stream */
      rv = nghttp2_session_resume_data(ctx->h2, stream->id);
      if(nghttp2_is_fatal(rv)) {
        *err = CURLE_SEND_ERROR;
        nwritten = -1;
        goto out;
      }
    }
  }
  else {
    nwritten = h2_submit(&stream, cf, data, buf, len, err);
    if(nwritten < 0) {
      goto out;
    }
    DEBUGASSERT(stream);
  }

  /* Call the nghttp2 send loop and flush to write ALL buffered data,
   * headers and/or request body completely out to the network */
  result = h2_progress_egress(cf, data);
  /* if the stream has been closed in egress handling (nghttp2 does that
   * when it does not like the headers, for example */
  if(stream && stream->closed && !was_blocked) {
    infof(data, "stream %u closed", stream->id);
    *err = CURLE_SEND_ERROR;
    nwritten = -1;
    goto out;
  }
  else if(result == CURLE_AGAIN) {
    blocked = 1;
  }
  else if(result) {
    *err = result;
    nwritten = -1;
    goto out;
  }
  else if(stream && !Curl_bufq_is_empty(&stream->sendbuf)) {
    /* although we wrote everything that nghttp2 wants to send now,
     * there is data left in our stream send buffer unwritten. This may
     * be due to the stream's HTTP/2 flow window being exhausted. */
    blocked = 1;
  }

  if(stream && blocked && nwritten > 0) {
    /* Unable to send all data, due to connection blocked or H2 window
     * exhaustion. Data is left in our stream buffer, or nghttp2's internal
     * frame buffer or our network out buffer. */
    size_t rwin = nghttp2_session_get_stream_remote_window_size(ctx->h2,
                                                                stream->id);
    /* Whatever the cause, we need to return CURL_EAGAIN for this call.
     * We have unwritten state that needs us being invoked again and EAGAIN
     * is the only way to ensure that. */
    stream->upload_blocked_len = nwritten;
    CURL_TRC_CF(data, cf, "[%d] cf_send(len=%zu) BLOCK: win %u/%zu "
                "blocked_len=%zu",
                stream->id, len,
                nghttp2_session_get_remote_window_size(ctx->h2), rwin,
                nwritten);
    *err = CURLE_AGAIN;
    nwritten = -1;
    goto out;
  }
  else if(should_close_session(ctx)) {
    /* nghttp2 thinks this session is done. If the stream has not been
     * closed, this is an error state for out transfer */
    if(stream->closed) {
      nwritten = http2_handle_stream_close(cf, data, stream, err);
    }
    else {
      CURL_TRC_CF(data, cf, "send: nothing to do in this session");
      *err = CURLE_HTTP2;
      nwritten = -1;
    }
  }

out:
  if(stream) {
    CURL_TRC_CF(data, cf, "[%d] cf_send(len=%zu) -> %zd, %d, "
                "upload_left=%" CURL_FORMAT_CURL_OFF_T ", "
                "h2 windows %d-%d (stream-conn), "
                "buffers %zu-%zu (stream-conn)",
                stream->id, len, nwritten, *err,
                stream->upload_left,
                nghttp2_session_get_stream_remote_window_size(
                  ctx->h2, stream->id),
                nghttp2_session_get_remote_window_size(ctx->h2),
                Curl_bufq_len(&stream->sendbuf),
                Curl_bufq_len(&ctx->outbufq));
  }
  else {
    CURL_TRC_CF(data, cf, "cf_send(len=%zu) -> %zd, %d, "
                "connection-window=%d, nw_send_buffer(%zu)",
                len, nwritten, *err,
                nghttp2_session_get_remote_window_size(ctx->h2),
                Curl_bufq_len(&ctx->outbufq));
  }
  CF_DATA_RESTORE(cf, save);
  return nwritten;
}